

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__stream_destroy(uv_stream_t *stream)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = uv__io_active(&stream->io_watcher,5);
  if (iVar2 != 0) {
    __assert_fail("!uv__io_active(&stream->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x1be,"void uv__stream_destroy(uv_stream_t *)");
  }
  if ((stream->flags & 2) == 0) {
    __assert_fail("stream->flags & UV_HANDLE_CLOSED",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x1bf,"void uv__stream_destroy(uv_stream_t *)");
  }
  if (stream->connect_req != (uv_connect_t *)0x0) {
    uVar1 = (stream->loop->active_reqs).count;
    if (uVar1 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x1c2,"void uv__stream_destroy(uv_stream_t *)");
    }
    (stream->loop->active_reqs).count = uVar1 - 1;
    (*stream->connect_req->cb)(stream->connect_req,-0x7d);
    stream->connect_req = (uv_connect_t *)0x0;
  }
  uv__stream_flush_write_queue(stream,-0x7d);
  uv__write_callbacks(stream);
  uv__drain(stream);
  if (stream->write_queue_size == 0) {
    return;
  }
  __assert_fail("stream->write_queue_size == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                ,0x1cb,"void uv__stream_destroy(uv_stream_t *)");
}

Assistant:

void uv__stream_destroy(uv_stream_t* stream) {
  assert(!uv__io_active(&stream->io_watcher, POLLIN | POLLOUT));
  assert(stream->flags & UV_HANDLE_CLOSED);

  if (stream->connect_req) {
    uv__req_unregister(stream->loop, stream->connect_req);
    stream->connect_req->cb(stream->connect_req, UV_ECANCELED);
    stream->connect_req = NULL;
  }

  uv__stream_flush_write_queue(stream, UV_ECANCELED);
  uv__write_callbacks(stream);
  uv__drain(stream);

  assert(stream->write_queue_size == 0);
}